

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.cpp
# Opt level: O1

bool r_exec::IPGMContext::Ins(IPGMContext *context,uint16_t *index)

{
  char cVar1;
  byte bVar2;
  byte bVar3;
  bool bVar4;
  short sVar5;
  ushort uVar6;
  int iVar7;
  undefined4 extraout_var;
  Code *destination;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  uint16_t index_00;
  Atom *pAVar8;
  Code *pCVar9;
  ulong uVar10;
  bool bVar11;
  IPGMContext arg;
  uint16_t extent_index;
  IPGMContext pattern_set;
  IPGMContext tsc;
  IPGMContext args;
  IPGMContext nfr;
  IPGMContext res;
  IPGMContext run;
  IPGMContext object;
  Atom local_2ac [4];
  Atom local_2a8 [4];
  Atom local_2a4 [4];
  Atom local_2a0 [6];
  short local_29a;
  IPGMContext *local_298;
  Atom local_28c [4];
  uint local_288;
  Atom local_284 [4];
  Atom local_280 [4];
  Atom local_27c [4];
  Code *local_278;
  IPGMContext local_270;
  IPGMContext local_240;
  IPGMContext local_210;
  IPGMContext local_1e0;
  IPGMContext local_1b0;
  IPGMContext local_180;
  IPGMContext local_150;
  IPGMContext local_120;
  IPGMContext local_f0;
  IPGMContext local_c0;
  IPGMContext local_90;
  IPGMContext local_60;
  
  getChild(&local_1b0,context,1);
  operator*(&local_f0,&local_1b0);
  getChild(&local_120,context,2);
  operator*(&local_1b0,&local_120);
  getChild(&local_1e0,context,3);
  operator*(&local_120,&local_1e0);
  getChild(&local_150,context,4);
  operator*(&local_1e0,&local_150);
  getChild(&local_180,context,5);
  operator*(&local_150,&local_180);
  getChild(&local_210,context,6);
  operator*(&local_180,&local_210);
  (*((local_f0.object)->super__Object)._vptr__Object[4])(local_f0.object,0);
  sVar5 = r_code::Atom::asOpcode();
  if ((sVar5 == Opcodes::Pgm) || (sVar5 == Opcodes::AntiPgm)) {
    cVar1 = r_code::Atom::getDescriptor();
    if (cVar1 == -0x3f) {
      (*((local_f0.object)->super__Object)._vptr__Object[4])(local_f0.object,1);
      uVar6 = r_code::Atom::asIndex();
      bVar2 = r_code::Atom::getAtomCount();
      (*((local_f0.object)->super__Object)._vptr__Object[4])(local_f0.object,(ulong)uVar6);
      bVar3 = r_code::Atom::getAtomCount();
      if (bVar3 == bVar2) {
        local_29a = sVar5;
        local_298 = context;
        iVar7 = (*((local_f0.object)->super__Object)._vptr__Object[4])(local_f0.object,0);
        local_210.super__Context.code = (Atom *)CONCAT44(extraout_var,iVar7);
        local_210.super__Context.overlay = (Overlay *)0x0;
        local_210.super__Context.data = REFERENCE;
        local_210.super__Context._vptr__Context = (_func_int **)&PTR___Context_001be3f0;
        local_278 = local_f0.object;
        local_210.object = local_f0.object;
        local_210.view = (View *)0x0;
        bVar11 = bVar2 == 0;
        local_210.super__Context.index = uVar6;
        if (!bVar11) {
          local_288 = (uint)bVar2;
          index_00 = 1;
          do {
            getChild(&local_240,&local_1b0,index_00);
            operator*(&local_270,&local_240);
            getChild(&local_c0,&local_210,index_00);
            operator*(&local_90,&local_c0);
            getChild(&local_60,&local_90,1);
            operator*(&local_240,&local_60);
            bVar4 = match(&local_240,&local_270);
            if (!bVar4) {
              r_code::Atom::Nil();
              _Context::setAtomicResult(&local_298->super__Context,local_28c);
              r_code::Atom::~Atom(local_28c);
              if (!bVar4) {
                return bVar11;
              }
            }
            bVar11 = (ushort)local_288 <= index_00;
            sVar5 = (1 - (ushort)bVar2) + index_00;
            index_00 = index_00 + 1;
          } while (sVar5 != 1);
        }
        pCVar9 = local_278;
        if (local_29a == Opcodes::AntiPgm) {
          pAVar8 = local_27c;
          r_code::Atom::InstantiatedAntiProgram((ushort)pAVar8,(uchar)Opcodes::IPgm);
          pCVar9 = local_278;
          destination = build_object(local_298,pAVar8);
        }
        else {
          (*(local_278->super__Object)._vptr__Object[4])(local_278,2);
          uVar6 = r_code::Atom::asIndex();
          (*(pCVar9->super__Object)._vptr__Object[4])(pCVar9,(ulong)uVar6);
          cVar1 = r_code::Atom::getAtomCount();
          if (cVar1 == '\0') {
            pAVar8 = local_280;
            r_code::Atom::InstantiatedInputLessProgram((ushort)pAVar8,(uchar)Opcodes::IPgm);
            destination = build_object(local_298,pAVar8);
          }
          else {
            pAVar8 = local_284;
            r_code::Atom::InstantiatedProgram((ushort)pAVar8,(uchar)Opcodes::IPgm);
            destination = build_object(local_298,pAVar8);
          }
        }
        r_code::Atom::~Atom(pAVar8);
        r_code::Atom::RPointer((ushort)&local_270);
        iVar7 = (*(destination->super__Object)._vptr__Object[4])(destination,1);
        r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_00,iVar7),(Atom *)&local_270);
        r_code::Atom::~Atom((Atom *)&local_270);
        (*(destination->super__Object)._vptr__Object[0x19])(destination,pCVar9);
        local_240.super__Context._vptr__Context._0_2_ = 0;
        r_code::Atom::IPointer((ushort)&local_270);
        iVar7 = (*(destination->super__Object)._vptr__Object[4])(destination,2);
        r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_01,iVar7),(Atom *)&local_270);
        r_code::Atom::~Atom((Atom *)&local_270);
        copy_structure<r_code::Code>(&local_1b0,destination,8,(uint16_t *)&local_240,true,-1);
        iVar7 = (*(destination->super__Object)._vptr__Object[4])(destination,3);
        r_code::Atom::operator=
                  ((Atom *)CONCAT44(extraout_var_02,iVar7),
                   local_120.super__Context.code + (ulong)local_120.super__Context.index * 4);
        r_code::Atom::IPointer((ushort)&local_270);
        iVar7 = (*(destination->super__Object)._vptr__Object[4])(destination,4);
        r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_03,iVar7),(Atom *)&local_270);
        r_code::Atom::~Atom((Atom *)&local_270);
        pAVar8 = local_1e0.super__Context.code;
        uVar10 = (ulong)local_1e0.super__Context.index;
        local_240.super__Context._vptr__Context._0_2_ =
             (short)local_240.super__Context._vptr__Context + 1;
        iVar7 = (*(destination->super__Object)._vptr__Object[4])(destination);
        r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_04,iVar7),pAVar8 + uVar10 * 4);
        pAVar8 = local_1e0.super__Context.code;
        uVar10 = (ulong)local_1e0.super__Context.index;
        local_240.super__Context._vptr__Context._0_2_ =
             (short)local_240.super__Context._vptr__Context + 1;
        iVar7 = (*(destination->super__Object)._vptr__Object[4])(destination);
        r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_05,iVar7),pAVar8 + uVar10 * 4 + 4);
        local_240.super__Context._vptr__Context._0_2_ =
             (short)local_240.super__Context._vptr__Context + 1;
        iVar7 = (*(destination->super__Object)._vptr__Object[4])(destination);
        r_code::Atom::operator=
                  ((Atom *)CONCAT44(extraout_var_06,iVar7),
                   local_1e0.super__Context.code + (ulong)local_1e0.super__Context.index * 4 + 8);
        iVar7 = (*(destination->super__Object)._vptr__Object[4])(destination,5);
        r_code::Atom::operator=
                  ((Atom *)CONCAT44(extraout_var_07,iVar7),
                   local_150.super__Context.code + (ulong)local_150.super__Context.index * 4);
        iVar7 = (*(destination->super__Object)._vptr__Object[4])(destination,6);
        r_code::Atom::operator=
                  ((Atom *)CONCAT44(extraout_var_08,iVar7),
                   local_180.super__Context.code + (ulong)local_180.super__Context.index * 4);
        r_code::Atom::Float(1.0);
        iVar7 = (*(destination->super__Object)._vptr__Object[4])(destination,7);
        r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_09,iVar7),(Atom *)&local_270);
        r_code::Atom::~Atom((Atom *)&local_270);
        addProduction(local_298,destination,false);
        r_code::Atom::ProductionPointer((ushort)local_2a8);
        _Context::setAtomicResult(&local_298->super__Context,local_2a8);
        r_code::Atom::~Atom(local_2a8);
        return bVar11;
      }
      r_code::Atom::Nil();
      _Context::setAtomicResult(&context->super__Context,local_2a4);
      pAVar8 = local_2a4;
    }
    else {
      r_code::Atom::Nil();
      _Context::setAtomicResult(&context->super__Context,local_2ac);
      pAVar8 = local_2ac;
    }
  }
  else {
    r_code::Atom::Nil();
    _Context::setAtomicResult(&context->super__Context,local_2a0);
    pAVar8 = local_2a0;
  }
  r_code::Atom::~Atom(pAVar8);
  return false;
}

Assistant:

bool IPGMContext::Ins(const IPGMContext &context, uint16_t &index)
{
    IPGMContext object = *context.getChild(1);
    IPGMContext args = *context.getChild(2);
    IPGMContext run = *context.getChild(3);
    IPGMContext tsc = *context.getChild(4);
    IPGMContext res = *context.getChild(5);
    IPGMContext nfr = *context.getChild(6);
    Code *pgm = object.getObject();
    uint16_t pgm_opcode = pgm->code(0).asOpcode();

    if (pgm_opcode != Opcodes::Pgm &&
        pgm_opcode != Opcodes::AntiPgm) {
        context.setAtomicResult(Atom::Nil());
        return false;
    }

    if (pgm && args[0].getDescriptor() == Atom::SET) {
        uint16_t pattern_set_index = pgm->code(PGM_TPL_ARGS).asIndex();
        uint16_t arg_count = args[0].getAtomCount();

        if (pgm->code(pattern_set_index).getAtomCount() != arg_count) {
            context.setAtomicResult(Atom::Nil());
            return false;
        }

        // match args with the tpl patterns in _object.
        IPGMContext pattern_set(pgm, pattern_set_index);

        for (uint16_t i = 1; i <= arg_count; ++i) {
            IPGMContext arg = *args.getChild(i);
            IPGMContext skel = *(*pattern_set.getChild(i)).getChild(1);

            if (!skel.match(arg)) {
                context.setAtomicResult(Atom::Nil());
                return false;
            }
        }

        Code *ipgm; // created in the production array.

        if (pgm_opcode == Opcodes::AntiPgm) {
            ipgm = context.build_object(Atom::InstantiatedAntiProgram(Opcodes::IPgm, IPGM_ARITY));
        } else {
            uint16_t input_index = pgm->code(PGM_INPUTS).asIndex();
            uint16_t input_count = pgm->code(input_index).getAtomCount();

            if (input_count == 0) {
                ipgm = context.build_object(Atom::InstantiatedInputLessProgram(Opcodes::IPgm, IPGM_ARITY));
            } else {
                ipgm = context.build_object(Atom::InstantiatedProgram(Opcodes::IPgm, IPGM_ARITY));
            }
        }

        ipgm->code(IPGM_PGM) = Atom::RPointer(0); // points to the pgm object.
        ipgm->add_reference(pgm);
        uint16_t extent_index = 0;
        ipgm->code(IPGM_ARGS) = Atom::IPointer(IPGM_ARITY + 1); // points to the arg set.
        args.copy(ipgm, IPGM_ARITY + 1, extent_index); // writes the args after psln_thr.
        ipgm->code(IPGM_RUN) = run[0];
        ipgm->code(IPGM_TSC) = Atom::IPointer(extent_index); // points to the tsc.
        ipgm->code(extent_index++) = tsc[0]; // writes the tsc after the args.
        ipgm->code(extent_index++) = tsc[1];
        ipgm->code(extent_index++) = tsc[2];
        ipgm->code(IPGM_RES) = res[0]; // res.
        ipgm->code(IPGM_NFR) = nfr[0]; // nfr.
        ipgm->code(IPGM_ARITY) = Atom::Float(1); // psln_thr.
        context.setAtomicResult(Atom::ProductionPointer(context.addProduction(ipgm, true))); // object may be new: we don't know at this point, therefore check=true.
        return true;
    }

    context.setAtomicResult(Atom::Nil());
    return false;
}